

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcInitCustomAlloc(_func_void_ptr_int *allocFunc,_func_void_void_ptr *deallocFunc)

{
  bool bVar1;
  int iVar2;
  Linker *this;
  ExecutorX86 *this_00;
  ExecutorRegVm *this_01;
  TraceScope traceScope;
  TraceScope TStack_28;
  
  NULLC::nullcLastError = "";
  if (NULLC::initialized == '\x01') {
    NULLC::nullcLastError = "ERROR: NULLC is already initialized";
    bVar1 = false;
  }
  else {
    if (NULLC::TraceGetContext()::context == '\0') {
      iVar2 = __cxa_guard_acquire(&NULLC::TraceGetContext()::context);
      if (iVar2 != 0) {
        NULLC::TraceContext::TraceContext((TraceContext *)NULLC::TraceGetContext()::context);
        __cxa_atexit(NULLC::TraceContext::~TraceContext,NULLC::TraceGetContext()::context,
                     &__dso_handle);
        __cxa_guard_release(&NULLC::TraceGetContext()::context);
      }
    }
    NULLCTime::clockMicroInit();
    NULLC::traceContext = NULLC::TraceGetContext()::context;
    if (nullcInitCustomAlloc::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcInitCustomAlloc::token);
      if (iVar2 != 0) {
        nullcInitCustomAlloc::token = NULLC::TraceGetToken("nullc","nullcInitCustomAlloc");
        __cxa_guard_release(&nullcInitCustomAlloc::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_28,nullcInitCustomAlloc::token);
    if (allocFunc == (_func_void_ptr_int *)0x0) {
      allocFunc = NULLC::defaultAlloc;
    }
    if (deallocFunc == (_func_void_void_ptr *)0x0) {
      deallocFunc = NULLC::defaultDealloc;
    }
    NULLC::fileLoad = NULLC::defaultFileLoad;
    NULLC::alloc = allocFunc;
    NULLC::dealloc = deallocFunc;
    NULLC::errorBuf = (*allocFunc)(0x10000);
    NULLC::outputBuf = (*(code *)NULLC::alloc)(0x2000);
    NULLC::tempOutputBuf = (*(code *)NULLC::alloc)(0x4000);
    BinaryCache::Initialize();
    BinaryCache::AddImportPath("");
    this = (Linker *)(*(code *)NULLC::alloc)(0xa20);
    Linker::Linker(this);
    NULLC::linker = this;
    NULLC::SetGlobalLimit(0x40000000);
    this_00 = (ExecutorX86 *)(*(code *)NULLC::alloc)(0x1568);
    ExecutorX86::ExecutorX86(this_00,NULLC::linker);
    NULLC::executorX86 = this_00;
    bVar1 = ExecutorX86::Initialize(this_00);
    if (!bVar1) {
      __assert_fail("initx86",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x79,"nullres nullcInitCustomAlloc(void *(*)(int), void (*)(void *))");
    }
    this_01 = (ExecutorRegVm *)(*(code *)NULLC::alloc)(0x2d0);
    ExecutorRegVm::ExecutorRegVm(this_01,NULLC::linker);
    NULLC::executorRegVm = this_01;
    NULLC::argBuf = (*(code *)NULLC::alloc)(0x10000);
    nullcInitTypeinfoModuleLinkerOnly(NULLC::linker);
    NULLC::initialized = '\x01';
    bVar1 = BuildBaseModule((Allocator *)NULLC::allocator,NULLC::optimizationLevel);
    if (!bVar1) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = "ERROR: Failed to initialize base module";
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    bVar1 = bVar1;
    NULLC::TraceScope::~TraceScope(&TStack_28);
  }
  return bVar1;
}

Assistant:

nullres nullcInitCustomAlloc(void* (*allocFunc)(int), void (*deallocFunc)(void*))
{
	using namespace NULLC;

	nullcLastError = "";

	if(initialized)
	{
		nullcLastError = "ERROR: NULLC is already initialized";
		return 0;
	}

	NULLC::traceContext = TraceGetContext();

	TRACE_SCOPE("nullc", "nullcInitCustomAlloc");

	NULLC::alloc = allocFunc ? allocFunc : NULLC::defaultAlloc;
	NULLC::dealloc = deallocFunc ? deallocFunc : NULLC::defaultDealloc;
	NULLC::fileLoad = NULLC::defaultFileLoad;

	errorBuf = (char*)NULLC::alloc(NULLC_ERROR_BUFFER_SIZE);
	outputBuf = (char*)NULLC::alloc(NULLC_OUTPUT_BUFFER_SIZE);
	tempOutputBuf = (char*)NULLC::alloc(NULLC_TEMP_OUTPUT_BUFFER_SIZE);

	BinaryCache::Initialize();
	BinaryCache::AddImportPath("");

#ifndef NULLC_NO_EXECUTOR
	linker = NULLC::construct<Linker>();

	NULLC::SetGlobalLimit(NULLC_DEFAULT_GLOBAL_MEMORY_LIMIT);
#endif

#ifdef NULLC_BUILD_X86_JIT
	executorX86 = new(NULLC::alloc(sizeof(ExecutorX86))) ExecutorX86(linker);
	bool initx86 = executorX86->Initialize();
	assert(initx86);
	(void)initx86;
#endif

#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	executorLLVM = new(NULLC::alloc(sizeof(ExecutorLLVM))) ExecutorLLVM(linker);
#endif

#ifndef NULLC_NO_EXECUTOR
	executorRegVm = new(NULLC::alloc(sizeof(ExecutorRegVm))) ExecutorRegVm(linker);
#endif

	argBuf = (char*)NULLC::alloc(64 * 1024);

#ifndef NULLC_NO_EXECUTOR
	nullcInitTypeinfoModuleLinkerOnly(linker);
#endif

	initialized = true;

	if(!BuildBaseModule(&allocator, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = "ERROR: Failed to initialize base module";
		return 0;
	}

	allocator.Clear();

	return 1;
}